

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_assert.cc
# Opt level: O3

void boost::assertion_failed_msg(char *expr,char *msg,char *param_3,char *file,long line)

{
  undefined8 extraout_RAX;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,expr,&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,file,&local_7a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,msg,&local_7b);
  lf::base::AssertionFailed(&local_38,&local_58,line,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void assertion_failed_msg(char const* expr, char const* msg,
                          char const* /*function*/, char const* file,
                          long line) {
  lf::base::AssertionFailed(expr, file, line, msg);  // NOLINT
}